

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTPNSymBase::fold_constants(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CTPNSymBase *pCVar5;
  CTcPrsSymtab *curtab;
  long *plVar4;
  
  iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xc])();
  iVar2 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xd])(this);
  do {
    iVar3 = (*symtab->_vptr_CTcPrsSymtab[2])
                      (symtab,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
    if (plVar4 != (long *)0x0) goto LAB_00235d64;
    symtab = symtab->parent_;
  } while (symtab != (CTcPrsSymtab *)0x0);
  plVar4 = (long *)0x0;
LAB_00235d64:
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x78))(plVar4);
    pCVar5 = (CTPNSymBase *)(**(code **)(*plVar4 + 0x18))(plVar4);
    if (pCVar5 != (CTPNSymBase *)0x0) {
      this = pCVar5;
    }
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNSymBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTcSymbol *sym;
    CTcPrsNode *ret;

    /*
     *   Look up my symbol.  At this stage, don't assume a definition;
     *   merely look to see if it's already known.  We don't have enough
     *   information to determine how we should define the symbol, so
     *   leave it undefined until code generation if it's not already
     *   known.  
     */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* ask the symbol to do the folding */
        ret = sym->fold_constant();

        /* if that succeeded, return it; otherwise, return unchanged */
        return (ret != 0 ? ret : this);
    }
    else
    {
        /* not defined - return myself unchanged */
        return this;
    }
}